

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O0

int object_increment_reference(object obj)

{
  int iVar1;
  long in_RDI;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    iVar1 = threading_atomic_ref_count_increment((threading_atomic_ref_count)(in_RDI + 0x20));
    if (iVar1 == 1) {
      local_4 = 1;
    }
    else {
      LOCK();
      object_stats.increments = object_stats.increments + 1;
      UNLOCK();
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int object_increment_reference(object obj)
{
	if (obj == NULL)
	{
		return 1;
	}

	if (threading_atomic_ref_count_increment(&obj->ref) == 1)
	{
		return 1;
	}

	reflect_memory_tracker_increment(object_stats);

	return 0;
}